

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Writer.h
# Opt level: O0

string * __thiscall
CSV::Writer<Protein>::EscapeStringForCSV
          (string *__return_storage_ptr__,Writer<Protein> *this,string *value)

{
  ulong uVar1;
  const_iterator __first;
  const_iterator __last;
  bool local_3d;
  bool needsEscaping;
  string *value_local;
  Writer<Protein> *this_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  uVar1 = std::__cxx11::string::empty();
  local_3d = true;
  if ((uVar1 & 1) == 0) {
    __first = std::array<char,_4UL>::begin(&EscapeStringForCSV::escapingRequiredChars);
    __last = std::array<char,_4UL>::end(&EscapeStringForCSV::escapingRequiredChars);
    local_3d = std::
               any_of<char_const*,CSV::Writer<Protein>::EscapeStringForCSV(std::__cxx11::string_const&)::_lambda(char)_1_>
                         (__first,__last,(anon_class_8_1_a8c68091_for__M_pred)value);
  }
  if (local_3d != false) {
    std::__cxx11::string::insert((ulong)__return_storage_ptr__,0,'\x01');
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EscapeStringForCSV( const std::string& value ) {
    std::string ret = value;

    static const std::array< char, 4 > escapingRequiredChars = { ',', '\"', '\r', '\n' };

    bool needsEscaping =
      value.empty() ||
      std::any_of(
        escapingRequiredChars.begin(), escapingRequiredChars.end(),
        [&]( const char ch ) { return value.find( ch ) != std::string::npos; } );

    if( needsEscaping ) {
      ret.insert( 0, 1, '\"' );
      ret += '\"';
    }

    return ret;
  }